

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O1

bool __thiscall
SGParser::Parse<SGParser::Generator::RegExprNFAParseElement>::DoParse
          (Parse<SGParser::Generator::RegExprNFAParseElement> *this,
          ParseHandler<SGParser::Generator::RegExprNFAParseElement> *parseHandler)

{
  BacktrackingTokenStream<SGParser::Generator::RegExprParseToken> *this_00;
  TokenType *token;
  ReduceProduction RVar1;
  RegExprNFAParseElement *pRVar2;
  pointer pRVar3;
  __node_base_ptr p_Var4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  __node_base_ptr p_Var9;
  _Hash_node_base *p_Var10;
  ulong uVar11;
  size_t *psVar12;
  size_t streamLength;
  size_t sVar13;
  __node_base_ptr p_Var14;
  ulong uVar15;
  short sVar16;
  ulong uVar17;
  size_t sVar18;
  uint uVar19;
  long lVar20;
  bool bVar21;
  int local_98;
  size_t local_68;
  TokenType local_60;
  TokenType tmpToken;
  String *local_40;
  String *local_38;
  
  uVar6 = this->TopState;
  if (uVar6 != 0xffffffff) {
    token = &this->Token;
    this_00 = &this->Stream;
    local_40 = &this->ErrorStackStr;
    do {
      this->pStack[this->StackPosition].
      super_ParseStackElement<SGParser::Generator::RegExprParseToken>.State = uVar6;
      if (this->NextTokenFlag == true) {
        BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetNextToken(this_00,token)
        ;
      }
      do {
        uVar6 = ParseTable::GetAction
                          (this->pParseTable,
                           this->pStack[this->StackPosition].
                           super_ParseStackElement<SGParser::Generator::RegExprParseToken>.State,
                           (this->Token).super_TokenCode.Code);
        sVar16 = (short)uVar6;
        while (sVar16 < 0) {
          uVar11 = this->StackPosition + 1;
          this->StackPosition = uVar11;
          if (this->StackSize <= uVar11) {
            __assert_fail("StackPosition < StackSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./Parser.h"
                          ,0x1c8,
                          "bool SGParser::Parse<SGParser::Generator::RegExprNFAParseElement>::DoParse(ParseHandler<StackElement> &)"
                         );
          }
          pRVar2 = this->pStack;
          pRVar2[uVar11].super_ParseStackElement<SGParser::Generator::RegExprParseToken>.State =
               uVar6 & 0x3fff;
          Generator::RegExprNFAParseElement::ShiftToken
                    (pRVar2 + uVar11,token,
                     &this_00->super_TokenStream<SGParser::Generator::RegExprParseToken>);
          uVar6 = (this->Token).super_TokenCode.Code;
          if (((byte)(this->pParseTable->Terminals).
                     super__Vector_base<SGParser::ParseTable::Terminal,_std::allocator<SGParser::ParseTable::Terminal>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar6] & 1) != 0) {
            uVar11 = (this->Stream).ThisPos;
            if (0x1ff < uVar11) goto LAB_0014000f;
            psVar12 = &this->pStack[this->StackPosition - 1].
                       super_ParseStackElement<SGParser::Generator::RegExprParseToken>.
                       TerminalMarker;
            if (uVar6 == 0) {
              psVar12 = &this->ErrorMarker;
            }
            sVar13 = *psVar12;
            sVar18 = ((this->Stream).pThisBlock)->Index;
            streamLength = BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::
                           GetBufferedLength(this_00,sVar13);
            BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::BacktrackToMarker
                      (this_00,sVar13,streamLength);
            if (((byte)(this->pParseTable->StateInfos).
                       super__Vector_base<SGParser::ParseTable::StateInfo,_std::allocator<SGParser::ParseTable::StateInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [this->pStack[this->StackPosition].
                        super_ParseStackElement<SGParser::Generator::RegExprParseToken>.State] & 2)
                == 0) {
              BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SeekTo
                        (this_00,sVar18 + uVar11);
            }
            else {
              BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::BacktrackToMarker
                        (this_00,this->pStack[this->StackPosition - 1].
                                 super_ParseStackElement<SGParser::Generator::RegExprParseToken>.
                                 TerminalMarker,0xffffffffffffffff);
            }
            (this->Stream).LengthLeft =
                 -(ulong)((this->Stream).pSourceStream !=
                         (TokenStream<SGParser::Generator::RegExprParseToken> *)0x0);
          }
          pRVar2 = this->pStack;
          sVar13 = this->StackPosition;
          if (((byte)(this->pParseTable->StateInfos).
                     super__Vector_base<SGParser::ParseTable::StateInfo,_std::allocator<SGParser::ParseTable::StateInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [pRVar2[sVar13].super_ParseStackElement<SGParser::Generator::RegExprParseToken>
                      .State] & 1) == 0) {
            pRVar2[sVar13].super_ParseStackElement<SGParser::Generator::RegExprParseToken>.
            TerminalMarker = 0xffffffffffffffff;
          }
          else {
            uVar11 = (this->Stream).ThisPos;
            if (0x1ff < uVar11) goto LAB_0014000f;
            sVar18 = uVar11 + ((this->Stream).pThisBlock)->Index;
            pRVar2[sVar13].super_ParseStackElement<SGParser::Generator::RegExprParseToken>.
            TerminalMarker = sVar18;
            BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SetMarker
                      (this_00,sVar18);
          }
          BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetNextToken
                    (this_00,token);
          uVar6 = ParseTable::GetAction
                            (this->pParseTable,
                             this->pStack[this->StackPosition].
                             super_ParseStackElement<SGParser::Generator::RegExprParseToken>.State,
                             (this->Token).super_TokenCode.Code);
          sVar16 = (short)uVar6;
        }
        local_38 = (String *)0x0;
        if ((uVar6 >> 0xe & 1) == 0) {
LAB_0013f930:
          bVar5 = AdvancedInput(this);
          if ((bVar5) ||
             (sVar13 = BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::
                       GetBufferedLength(this_00,this->ErrorMarker), sVar13 == 0)) {
            if (this->ErrorMarker != 0xffffffffffffffff) {
              BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::ReleaseMarker
                        (this_00,this->ErrorMarker);
            }
            uVar11 = (this->Stream).ThisPos;
            if (0x1ff < uVar11) goto LAB_0014000f;
            sVar13 = (uVar11 + ((this->Stream).pThisBlock)->Index) - 1;
            this->ErrorMarker = sVar13;
            BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SetMarker
                      (this_00,sVar13);
          }
          uVar11 = this->pParseTable->ActionWidth;
          if (uVar11 != 0) {
            memset(this->pValidTokenStackPositions,0xff,uVar11 * 8);
          }
          uVar17 = this->StackPosition;
          uVar15 = 0;
          local_68 = 0;
          tmpToken.ch = 0;
          bVar5 = false;
          do {
            sVar13 = uVar17 - uVar15;
            uVar6 = ParseTable::GetAction
                              (this->pParseTable,
                               this->pStack[sVar13].
                               super_ParseStackElement<SGParser::Generator::RegExprParseToken>.State
                               ,(uint)local_38);
            if ((uVar6 & 0xc000) == 0) {
LAB_0013fb3f:
              bVar21 = true;
            }
            else {
              uVar19 = uVar6 & 0x3fff;
              bVar5 = true;
              sVar18 = sVar13;
              do {
                if ((uVar6 >> 0xe & 1) == 0) break;
                uVar7 = ParseTable::GetReduceActionPopSize(this->pParseTable,uVar19);
                if (uVar7 == 0) {
LAB_0013fa9d:
                  bVar5 = false;
                  bVar21 = false;
                }
                else {
                  sVar18 = sVar18 - (uVar7 - 1);
                  if (this->StackSize <= sVar18 - 1) {
                    __assert_fail("pos > 0u && pos <= StackSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./Parser.h"
                                  ,599,
                                  "bool SGParser::Parse<SGParser::Generator::RegExprNFAParseElement>::DoParse(ParseHandler<StackElement> &)"
                                 );
                  }
                  uVar7 = ParseTable::GetReduceState
                                    (this->pParseTable,
                                     this->pStack[sVar18 - 1].
                                     super_ParseStackElement<SGParser::Generator::RegExprParseToken>
                                     .State,uVar19);
                  if (uVar7 == 0xffffffff) goto LAB_0013fa9d;
                  uVar6 = ParseTable::GetAction(this->pParseTable,uVar7,(uint)local_38);
                  uVar19 = uVar6 & 0x3fff;
                  bVar21 = true;
                }
              } while (bVar21);
              if (!bVar5) {
LAB_0013faf2:
                local_98 = (int)uVar11;
                if (local_98 != 0) {
                  uVar17 = 0;
                  do {
                    if ((this->pValidTokenStackPositions[uVar17] == 0xffffffffffffffff) &&
                       (uVar6 = ParseTable::GetAction(this->pParseTable,uVar19,(uint)uVar17),
                       (uVar6 & 0xc000) != 0)) {
                      this->pValidTokenStackPositions[uVar17] = sVar13;
                    }
                    uVar17 = uVar17 + 1;
                  } while ((uVar11 & 0xffffffff) != uVar17);
                }
                bVar5 = true;
                goto LAB_0013fb3f;
              }
              uVar6 = ParseTable::GetAction
                                (this->pParseTable,uVar19,(this->Token).super_TokenCode.Code);
              bVar5 = true;
              bVar21 = (uVar6 & 0xc000) == 0;
              tmpToken.ch = tmpToken.ch & 0xff;
              if (bVar21) goto LAB_0013faf2;
              tmpToken.ch = 1;
              local_68 = sVar13;
            }
            if (!bVar21) break;
            uVar15 = uVar15 + 1;
            uVar17 = this->StackPosition;
          } while (uVar15 <= uVar17);
          if (bVar5) {
            if ((tmpToken.ch & 1) == 0) {
              if (this->pValidTokenStackPositions[(this->Token).super_TokenCode.Code] !=
                  0xffffffffffffffff) {
                __assert_fail("pValidTokenStackPositions[Token.Code] == InvalidIndex",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./Parser.h"
                              ,0x294,
                              "bool SGParser::Parse<SGParser::Generator::RegExprNFAParseElement>::DoParse(ParseHandler<StackElement> &)"
                             );
              }
              local_60 = *token;
              do {
                iVar8 = 0xd;
                if (local_60.super_TokenCode.Code == 0) {
                  uVar11 = (this->Stream).ThisPos;
                  if (0x1ff < uVar11) goto LAB_0014000f;
                  if (uVar11 + ((this->Stream).pThisBlock)->Index <= this->PrevTokenIndex)
                  goto LAB_0013fe41;
                }
                else if (local_60.super_TokenCode.Code == 1) {
LAB_0013fe41:
                  bVar5 = false;
                  goto LAB_0013fe44;
                }
                BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetNextToken
                          (this_00,&local_60);
              } while (this->pValidTokenStackPositions[(ulong)local_60 & 0xffffffff] ==
                       0xffffffffffffffff);
              uVar6 = ParseTable::GetAction
                                (this->pParseTable,
                                 this->pStack[this->StackPosition].
                                 super_ParseStackElement<SGParser::Generator::RegExprParseToken>.
                                 State,(uint)local_38);
              iVar8 = 0;
              bVar5 = true;
              if ((uVar6 >> 0xe & 1) == 0) {
                CleanupParseStack(this,this->pValidTokenStackPositions[(ulong)local_60 & 0xffffffff]
                                 );
              }
LAB_0013fe44:
              if (bVar5) goto LAB_0013fe4d;
            }
            else {
              uVar6 = ParseTable::GetAction
                                (this->pParseTable,
                                 this->pStack[this->StackPosition].
                                 super_ParseStackElement<SGParser::Generator::RegExprParseToken>.
                                 State,(uint)local_38);
              if ((uVar6 >> 0xe & 1) == 0) {
                CleanupParseStack(this,local_68);
              }
LAB_0013fe4d:
              uVar11 = (this->Stream).ThisPos;
              if (0x1ff < uVar11) {
LAB_0014000f:
                __assert_fail("ThisPos < StreamBlock::BufferSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./BacktrackingTokenStream.h"
                              ,0xd2,
                              "size_t SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetTokenIndex() const [Token = SGParser::Generator::RegExprParseToken]"
                             );
              }
              this->PrevTokenIndex = uVar11 + ((this->Stream).pThisBlock)->Index;
              BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SeekBack(this_00,1);
              (this->Token).super_TokenCode.Code = (uint)local_38;
              iVar8 = 4;
            }
            local_40 = local_38;
          }
          else {
            this->LastErrorState =
                 this->pStack[this->StackPosition].
                 super_ParseStackElement<SGParser::Generator::RegExprParseToken>.State;
            PrintStack(this,&this->ErrorStackStr);
            iVar8 = 0xd;
            local_40 = local_38;
          }
        }
        else {
          iVar8 = 1;
          if (uVar6 != 0x4fff) {
            uVar11 = (ulong)(uVar6 & 0x3fff);
            pRVar3 = (this->pParseTable->ReduceProductions).
                     super__Vector_base<SGParser::ParseTable::ReduceProduction,_std::allocator<SGParser::ParseTable::ReduceProduction>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(this->pParseTable->ReduceProductions).
                              super__Vector_base<SGParser::ParseTable::ReduceProduction,_std::allocator<SGParser::ParseTable::ReduceProduction>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar3 >> 2) <=
                uVar11) {
              __assert_fail("prodId < ReduceProductions.size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./ParseTable.h"
                            ,0x97,
                            "ReduceProduction SGParser::ParseTable::GetReduceProduction(unsigned int) const"
                           );
            }
            RVar1 = pRVar3[uVar11];
            uVar17 = (ulong)RVar1._0_1_;
            if (uVar17 != 0) {
              lVar20 = 0;
              do {
                sVar13 = this->pStack[this->StackPosition + lVar20].
                         super_ParseStackElement<SGParser::Generator::RegExprParseToken>.
                         TerminalMarker;
                if (sVar13 != 0xffffffffffffffff) {
                  BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::ReleaseMarker
                            (this_00,sVar13);
                }
                lVar20 = lVar20 + -1;
              } while (-lVar20 != uVar17);
            }
            lVar20 = this->StackPosition - uVar17;
            this->StackPosition = lVar20 + 1;
            uVar7 = (uint)RVar1 >> 8 & 0x3fffff;
            uVar19 = ParseTable::GetLeftReduceState
                               (this->pParseTable,
                                this->pStack[lVar20].
                                super_ParseStackElement<SGParser::Generator::RegExprParseToken>.
                                State,uVar7);
            this->TopState = uVar19;
            if (uVar19 == 0xffffffff) {
              if (this->StackPosition == 0) {
                __assert_fail("StackPosition > 0u",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./Parser.h"
                              ,0x202,
                              "bool SGParser::Parse<SGParser::Generator::RegExprNFAParseElement>::DoParse(ParseHandler<StackElement> &)"
                             );
              }
              this->StackPosition = this->StackPosition - 1;
              (this->Token).super_TokenCode.Code = 0;
              uVar11 = (this->Stream).ThisPos;
              if (0x1ff < uVar11) goto LAB_0014000f;
              this->PrevTokenIndex = uVar11 + ((this->Stream).pThisBlock)->Index;
              BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SeekBack(this_00,1);
              iVar8 = 4;
LAB_0013fe3a:
              bVar5 = false;
            }
            else {
              this->NextTokenFlag = false;
              this->ReduceLeft = uVar7;
              if (((uint)RVar1 & 0xff) == 0) {
                if (((byte)(this->pParseTable->StateInfos).
                           super__Vector_base<SGParser::ParseTable::StateInfo,_std::allocator<SGParser::ParseTable::StateInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar19] & 1) == 0) {
                  this->pStack[this->StackPosition].
                  super_ParseStackElement<SGParser::Generator::RegExprParseToken>.TerminalMarker =
                       0xffffffffffffffff;
                }
                else {
                  uVar17 = (this->Stream).ThisPos;
                  if (0x1ff < uVar17) goto LAB_0014000f;
                  sVar13 = uVar17 + ((this->Stream).pThisBlock)->Index;
                  this->pStack[this->StackPosition].
                  super_ParseStackElement<SGParser::Generator::RegExprParseToken>.TerminalMarker =
                       sVar13;
                  BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SetMarker
                            (this_00,sVar13);
                }
              }
              if ((((uint)RVar1 >> 0x1e & 1) == 0) &&
                 (iVar8 = (*parseHandler->_vptr_ParseHandler[2])(parseHandler,this,uVar11),
                 (char)iVar8 == '\0')) {
                iVar8 = 0xd;
              }
              else {
                iVar8 = 2;
                if ((int)RVar1 < 0) {
                  uVar6 = this->ReduceLeft << 0x10 | uVar6 & 0x3fff;
                  local_40 = (String *)(ulong)uVar6;
                  uVar11 = (this->pParseTable->ProductionErrorTerminals)._M_h._M_bucket_count;
                  uVar17 = (ulong)local_40 % uVar11;
                  p_Var4 = (this->pParseTable->ProductionErrorTerminals)._M_h._M_buckets[uVar17];
                  p_Var9 = (__node_base_ptr)0x0;
                  if ((p_Var4 != (__node_base_ptr)0x0) &&
                     (p_Var9 = p_Var4, p_Var14 = p_Var4->_M_nxt,
                     uVar6 != *(uint *)&p_Var4->_M_nxt[1]._M_nxt)) {
                    while (p_Var10 = p_Var14->_M_nxt, p_Var10 != (_Hash_node_base *)0x0) {
                      p_Var9 = (__node_base_ptr)0x0;
                      if (((ulong)*(uint *)&p_Var10[1]._M_nxt % uVar11 != uVar17) ||
                         (p_Var9 = p_Var14, p_Var14 = p_Var10, uVar6 == *(uint *)&p_Var10[1]._M_nxt)
                         ) goto LAB_0013f713;
                    }
                    p_Var9 = (__node_base_ptr)0x0;
                  }
LAB_0013f713:
                  if (p_Var9 == (__node_base_ptr)0x0) {
                    p_Var10 = (_Hash_node_base *)0x0;
                  }
                  else {
                    p_Var10 = p_Var9->_M_nxt;
                  }
                  if (p_Var10 == (_Hash_node_base *)0x0) goto LAB_0013fe3a;
                  local_40 = (String *)(ulong)(*(uint *)((long)&p_Var10[1]._M_nxt + 4) & 0xfffffff);
                  iVar8 = 0x11;
                  bVar5 = true;
                  goto LAB_0013ff8d;
                }
              }
              bVar5 = false;
            }
LAB_0013ff8d:
            local_38 = (String *)((ulong)local_40 & 0xffffffff);
            if (bVar5) goto LAB_0013f930;
          }
        }
      } while (iVar8 == 4);
      if (iVar8 != 2) {
        if (iVar8 != 0xd) {
          return true;
        }
        CleanupParseStack(this,0);
        return false;
      }
      uVar6 = this->TopState;
    } while (uVar6 != 0xffffffff);
  }
  return false;
}

Assistant:

bool Parse<StackElement>::DoParse(ParseHandler<StackElement>& parseHandler) {
    unsigned errorCode;

    // Continue to parse until we encounter an error or accept
    while (true) {
        // Check the top state to make sure it is valid
        if (TopState == InvalidState)
            return false;

        // Store result from the previous step
        pStack[StackPosition].State = TopState;

        // Get the token code if needed
        if (NextTokenFlag)
            GetNextToken(Token);

    try_next_action:
        // Keep shifting as long as 'Shift' action is selected
        auto actionEntry = pParseTable->GetAction(pStack[StackPosition].State, Token.Code);
        while (actionEntry & ParseTable::ShiftMask) {
            ++StackPosition;
            SG_ASSERT(StackPosition < StackSize);
            pStack[StackPosition].State = actionEntry & ParseTable::ExtractMask;

            // User callback (to get at token data)
            pStack[StackPosition].ShiftToken(Token, Stream);
            if (pParseTable->Terminals[Token.Code].ErrorTerminal) {
                const auto marker = Token.Code == TokenCode::TokenError
                                        ? ErrorMarker
                                        : pStack[StackPosition - 1u].TerminalMarker;
                const auto offset = Stream.GetTokenIndex();
                Stream.BacktrackToMarker(marker, Stream.GetBufferedLength(marker));
                pStack[StackPosition].SetErrorData(Token, Stream);
                // If it's a backtracking error, backtrack & retry the whole thing
                if (pParseTable->StateInfos[pStack[StackPosition].State].BacktrackOnError)
                    Stream.BacktrackToMarker(pStack[StackPosition - 1u].TerminalMarker);
                else
                    Stream.SeekTo(offset);
                Stream.SetMaxStreamLength();
            }

            // Start recording if needed
            if (pParseTable->StateInfos[pStack[StackPosition].State].Record)
                Stream.SetMarker(pStack[StackPosition].TerminalMarker = Stream.GetTokenIndex());
            else
                pStack[StackPosition].TerminalMarker = InvalidIndex;

            // Get next token
            GetNextToken(Token);
            // And get next action
            actionEntry = pParseTable->GetAction(pStack[StackPosition].State, Token.Code);
        }

        // Do Reduce
        if (actionEntry & ParseTable::ReduceMask) {
            // See if we have accepted
            if (actionEntry == ParseTable::AcceptValue)
                return true;

            // On reduce, this is the production Id
            const auto ReducedProd = actionEntry & ParseTable::ExtractMask;
            const auto rprod       = pParseTable->GetReduceProduction(ReducedProd);

            // Release all markers
            for (size_t i = 0u; i < size_t(rprod.Length); ++i)
                if (pStack[StackPosition - i].TerminalMarker != InvalidIndex)
                    Stream.ReleaseMarker(pStack[StackPosition - i].TerminalMarker);

            // Pop the production (size-1), (point to the top element
            // so it can be accessed with [])
            StackPosition = StackPosition + 1u - size_t(rprod.Length);
            // Get next state (consult goto)
            TopState      = pParseTable->GetLeftReduceState(pStack[StackPosition - 1u].State,
                                                            rprod.Left);
            if (TopState == InvalidState) {
                // Cleanup the stack, including [StackPosition].
                for (size_t i = size_t(rprod.Length + 1u); i > 0u; --i)
                    pStack[StackPosition + i - 1u].Cleanup();
                // Revert to previous stack position.
                SG_ASSERT(StackPosition > 0u);
                --StackPosition;
                // Set Token.Code to '%error', which will allow try_next_action to process
                // appropriately, with either shift or reduce.
                Token.Code     = TokenCode::TokenError;
                // Backtrack by one token so that the first valid token can be re-consumed
                // properly following an error.
                PrevTokenIndex = Stream.GetTokenIndex();
                Stream.SeekBack(1u);
                goto try_next_action;
            }
            NextTokenFlag = false;
            ReduceLeft    = rprod.Left;

            // If the Stack Position advanced we must make sure to set the terminal marker
            if (rprod.Length == 0u) {
                // Start recording if needed
                if (pParseTable->StateInfos[TopState].Record)
                    Stream.SetMarker(pStack[StackPosition].TerminalMarker =
                        Stream.GetTokenIndex());
                else
                    pStack[StackPosition].TerminalMarker = InvalidIndex;
            }

            // If the reduce function fails than return an error
            if (!rprod.NotReported && !parseHandler.Reduce(*this, ReducedProd))
                goto step_error;

            // Cleanup the stack after [StackPosition].
            // Leave the element at stack position unchanged since it holds the Reduce result.
            for (size_t i = size_t(rprod.Length); i > 0u; --i)
                pStack[StackPosition + i].Cleanup();

            // See if this production has to throw a named error
            if (rprod.ErrorTerminalFlag) {
                errorCode = ReducedProd | (ReduceLeft << 16u);
                if (const auto it = pParseTable->ProductionErrorTerminals.find(errorCode);
                    it != pParseTable->ProductionErrorTerminals.end()) {
                    errorCode = it->second;
                    errorCode &= ProductionMask::TerminalValue;
                    goto handle_error;
                }
            }
            continue;
        }

        // An Error has occurred, deal with it
        errorCode = TokenCode::TokenError;

    handle_error:
        // Note that if we haven't advanced input, it's the same error as before
        if (AdvancedInput() || Stream.GetBufferedLength(ErrorMarker) == 0u) {
            if (ErrorMarker != InvalidIndex)
                Stream.ReleaseMarker(ErrorMarker);
            ErrorMarker = Stream.GetTokenIndex() - 1u;
            Stream.SetMarker(ErrorMarker);
        }

        // Calculate valid token set
        bool       errorProdFound    = false;
        bool       nextActionValid   = false;
        size_t     nextStackPosition = 0u;
        const auto maxToken          = pParseTable->GetTerminalCount();
        std::fill(pValidTokenStackPositions, pValidTokenStackPositions + maxToken, InvalidIndex);

        // Search stack until a state with action on 'error' is found
        for (size_t i = 0u; i <= StackPosition; ++i) {
            const auto sp = StackPosition - i;
            actionEntry   = pParseTable->GetAction(pStack[sp].State, errorCode);
            if (actionEntry & (ParseTable::ShiftMask | ParseTable::ReduceMask)) {
                // If the action is reduce, we have to try reducing until we
                // finally shift the error token
                // Once we shift, we can look for the next valid token
                auto pos            = sp;
                auto actionVal      = actionEntry & ParseTable::ExtractMask;
                bool needNextAction = true;

                while (actionEntry & ParseTable::ReduceMask) {
                    // Check special case (Accept)
                    const auto length = pParseTable->GetReduceActionPopSize(actionVal);
                    if (length == 0u) {
                        needNextAction = false;
                        break;
                    }
                    pos -= length - 1u;
                    SG_ASSERT(pos > 0u && pos <= StackSize);
                    // Check special case (reduce state for action is invalid)
                    const auto state = pParseTable->GetReduceState(pStack[pos - 1u].State, actionVal);
                    if (state == InvalidState) {
                        needNextAction = false;
                        break;
                    }
                    actionEntry = pParseTable->GetAction(state, errorCode);
                    actionVal   = actionEntry & ParseTable::ExtractMask;
                }

                // We should be shifting next, so actionVal is a state that'll be
                // on stack once we shift error
                errorProdFound = true;

                if (needNextAction) {
                    const auto nextActionAfterError = pParseTable->GetAction(actionVal, Token.Code);
                    if ((nextActionAfterError & (ParseTable::ShiftMask | ParseTable::ReduceMask)) != 0) {
                        nextActionValid   = true;
                        nextStackPosition = sp;
                        break;
                    }
                }

                // Go through all symbols, and collect allowed tokens
                for (unsigned j = 0u; j < unsigned(maxToken); ++j)
                    if (pValidTokenStackPositions[j] == InvalidIndex)
                        if (pParseTable->GetAction(actionVal, j) & ParseTable::ActionMask)
                            pValidTokenStackPositions[j]  = sp;
            }
        }

        if (!errorProdFound) {
            LastErrorState = pStack[StackPosition].State;
            PrintStack(ErrorStackStr);
            goto step_error;
        }

        if (nextActionValid) {
            // If there are reductions we can do on 'error' lookahead, do them first
            if ((pParseTable->GetAction(pStack[StackPosition].State, errorCode) &
                 ParseTable::ReduceMask) == 0u) {
                // Flush the remainder of stack symbols (this will also set StackPosition=sp)
                CleanupParseStack(nextStackPosition);
            }
        } else {
            // If an error production was found up the stack, we try to recover. This involves:
            //  1. Skipping all tokens, potentially including the last token that triggered the error,
            //     until a valid token is found.
            //       - No tokens may be skipped at all if the offending token is actually valid directly
            //         after an error. If you wrote "(5 + )" instead of "(5 + 5)" your original error
            //         token may be ')' but it doesn't actually need to be skipped.
            //         In this case, pValidTokenStackPositions[Token.Code] is valid up the stack, so no skipping
            //         takes place.
            //  2. Rolling back the stack, which includes StackPosition to a state that accepts
            //     an error followed by our next token. This is done by
            //         CleanupParseStack(pValidTokenStackPositions[Token.Code])
            //  3. Backtracking by one token and setting Token.Code to 'errorCode' to continue parsing.
            //         This will cause '%error' to be shifted onto the stack and allow things
            //         to move on with the next valid token after it.
            // (1.) Skip all 'unacceptable' tokens until a valid token, if any.
            SG_ASSERT(pValidTokenStackPositions[Token.Code] == InvalidIndex);
            TokenType tmpToken = Token;
            do {
                if (tmpToken.Code == TokenCode::TokenEOF) {
                    // If EOF was not in a valid look-ahead following %error, and we have hit
                    // the end of file, there is nothing left to do.
                    goto step_error;
                }
                if (tmpToken.Code == TokenCode::TokenError) {
                    // There are two reasons we can end up here:
                    //   a) Tokenizer generated TokenError because it saw unexpected characters,
                    //      which it had no reg-exp for. If this is the case, just skip them.
                    //   b) This is a second time through the error-handling loop for the same token.
                    //      We've already set Token.Code = errorCode for this token and tried
                    //      to recover, but for some reason this didn't work and we are back here.
                    //      Fail if this is the case.
                    if (PrevTokenIndex >= Stream.GetTokenIndex())
                        goto step_error;
                }
                GetNextToken(tmpToken);
            } while (pValidTokenStackPositions[tmpToken.Code] == InvalidIndex);
            // If there are reductions we can do on 'error' lookahead, do them first
            if ((pParseTable->GetAction(pStack[StackPosition].State, errorCode) &
                 ParseTable::ReduceMask) == 0u) {
                // (2.) Flush the remainder of stack symbols (this will also set StackPosition=sp)
                CleanupParseStack(pValidTokenStackPositions[tmpToken.Code]);
            }
        }
        // Set Token.Code to '%error', which will allow try_next_action to process appropriately,
        // with either shift or reduce. Also backtrack by one token so that the first valid token
        // can be re-consumed properly following an error.
        PrevTokenIndex = Stream.GetTokenIndex();
        Stream.SeekBack(1u);
        Token.Code = errorCode;
        goto try_next_action;
    }

step_error:
    // Clean up the parse stack by freeing all the elements
    CleanupParseStack();
    return false;
}